

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall
Physical::Physical(Physical *this,string *name,string *unitPrefix,string *unitSymbol)

{
  string local_e0;
  string local_c0;
  Unit local_a0;
  string *local_28;
  string *unitSymbol_local;
  string *unitPrefix_local;
  string *name_local;
  Physical *this_local;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_001904a0;
  local_28 = unitSymbol;
  unitSymbol_local = unitPrefix;
  unitPrefix_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->physicalDescription);
  Unit::Unit(&this->physicalUnit);
  std::__cxx11::string::operator=((string *)&this->physicalDescription,(string *)name);
  std::__cxx11::string::string((string *)&local_c0,(string *)unitPrefix);
  std::__cxx11::string::string((string *)&local_e0,(string *)unitSymbol);
  Unit::Unit(&local_a0,&local_c0,&local_e0);
  Unit::operator=(&this->physicalUnit,&local_a0);
  Unit::~Unit(&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

Physical::Physical( string name, string unitPrefix, string unitSymbol )
{
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
}